

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O3

void qt_split_namespace(QString *prefix,QString *name,QString *qName,bool hasURI)

{
  char16_t *pcVar1;
  qsizetype qVar2;
  QArrayData *pQVar3;
  long in_FS_OFFSET;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.ptr = (qName->d).ptr;
  local_58.d.d = (Data *)(qName->d).size;
  qVar2 = QStringView::indexOf((QStringView *)&local_58,(QChar)0x3a,0,CaseSensitive);
  if (qVar2 != -1) {
    QString::left(&local_58,qName,qVar2);
    pQVar3 = &((prefix->d).d)->super_QArrayData;
    pcVar1 = (prefix->d).ptr;
    (prefix->d).d = local_58.d.d;
    (prefix->d).ptr = local_58.d.ptr;
    qVar2 = (prefix->d).size;
    (prefix->d).size = local_58.d.size;
    local_58.d.d = (Data *)pQVar3;
    local_58.d.ptr = pcVar1;
    local_58.d.size = qVar2;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
    QString::mid((longlong)&local_58,(longlong)qName);
    pQVar3 = &((name->d).d)->super_QArrayData;
    pcVar1 = (name->d).ptr;
    *(undefined4 *)&(name->d).d = local_58.d.d._0_4_;
    *(undefined4 *)((long)&(name->d).d + 4) = local_58.d.d._4_4_;
    *(undefined4 *)&(name->d).ptr = local_58.d.ptr._0_4_;
    *(undefined4 *)((long)&(name->d).ptr + 4) = local_58.d.ptr._4_4_;
    qVar2 = (name->d).size;
    (name->d).size = local_58.d.size;
    local_58.d.d = (Data *)pQVar3;
    local_58.d.ptr = pcVar1;
    local_58.d.size = qVar2;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
    goto LAB_00112349;
  }
  if (hasURI) {
    pQVar3 = &((prefix->d).d)->super_QArrayData;
    (prefix->d).d = (Data *)0x0;
    (prefix->d).ptr = L"";
    (prefix->d).size = 0;
LAB_00112325:
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
  }
  else if ((prefix->d).ptr != (char16_t *)0x0) {
    pQVar3 = &((prefix->d).d)->super_QArrayData;
    (prefix->d).d = (Data *)0x0;
    (prefix->d).ptr = (char16_t *)0x0;
    (prefix->d).size = 0;
    goto LAB_00112325;
  }
  QString::operator=(name,qName);
LAB_00112349:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void qt_split_namespace(QString& prefix, QString& name, const QString& qName, bool hasURI)
{
    qsizetype i = qName.indexOf(u':');
    if (i == -1) {
        if (hasURI)
            prefix = u""_s;
        else
            prefix.clear();
        name = qName;
    } else {
        prefix = qName.left(i);
        name = qName.mid(i + 1);
    }
}